

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

void __thiscall FString::MergeChars(FString *this,char *charset,char newchar)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  ulong uVar6;
  size_t newlen;
  
  LockBuffer(this);
  pcVar4 = this->Chars;
  uVar1 = *(uint *)(pcVar4 + -0xc);
  if ((ulong)uVar1 == 0) {
    newlen = 0;
  }
  else {
    uVar6 = 0;
    newlen = 0;
    do {
      pcVar4 = this->Chars;
      cVar5 = pcVar4[uVar6];
      pcVar3 = strchr(charset,(int)cVar5);
      if (pcVar3 == (char *)0x0) {
        uVar6 = uVar6 + 1;
      }
      else {
        do {
          lVar2 = uVar6 + 1;
          uVar6 = uVar6 + 1;
          pcVar3 = strchr(charset,(int)pcVar4[lVar2]);
          cVar5 = newchar;
        } while (pcVar3 != (char *)0x0);
      }
      pcVar4[newlen] = cVar5;
      newlen = newlen + 1;
    } while (uVar6 < uVar1);
    pcVar4 = this->Chars;
  }
  pcVar4[newlen] = '\0';
  ReallocBuffer(this,newlen);
  UnlockBuffer(this);
  return;
}

Assistant:

void FString::MergeChars (const char *charset, char newchar)
{
	size_t read, write, mylen;

	LockBuffer();
	for (read = write = 0, mylen = Len(); read < mylen; )
	{
		if (strchr (charset, Chars[read]) != NULL)
		{
			while (strchr (charset, Chars[++read]) != NULL)
			{
			}
			Chars[write++] = newchar;
		}
		else
		{
			Chars[write++] = Chars[read++];
		}
	}
	Chars[write] = '\0';
	ReallocBuffer (write);
	UnlockBuffer();
}